

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_parsed_ir.cpp
# Opt level: O0

void __thiscall diligent_spirv_cross::ParsedIR::add_typed_id(ParsedIR *this,Types type,ID id)

{
  bool bVar1;
  uint32_t uVar2;
  Types TVar3;
  size_t sVar4;
  CompilerError *pCVar5;
  Variant *pVVar6;
  Types type_local;
  ParsedIR *this_local;
  ID id_local;
  
  this_local._4_4_ = id.id;
  uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)((long)&this_local + 4));
  sVar4 = VectorView<diligent_spirv_cross::Variant>::size
                    (&(this->ids).super_VectorView<diligent_spirv_cross::Variant>);
  if (sVar4 <= uVar2) {
    __assert_fail("id < ids.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Cross/spirv_cross_parsed_ir.cpp"
                  ,0x3a3,"void diligent_spirv_cross::ParsedIR::add_typed_id(Types, ID)");
  }
  if (this->loop_iteration_depth_hard != 0) {
    pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
    CompilerError::CompilerError(pCVar5,"Cannot add typed ID while looping over it.");
    __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
  }
  if (this->loop_iteration_depth_soft != 0) {
    uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)((long)&this_local + 4));
    pVVar6 = VectorView<diligent_spirv_cross::Variant>::operator[]
                       (&(this->ids).super_VectorView<diligent_spirv_cross::Variant>,(ulong)uVar2);
    bVar1 = Variant::empty(pVVar6);
    if (bVar1) {
      return;
    }
    pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
    CompilerError::CompilerError(pCVar5,"Cannot override IDs when loop is soft locked.");
    __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
  }
  uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)((long)&this_local + 4));
  pVVar6 = VectorView<diligent_spirv_cross::Variant>::operator[]
                     (&(this->ids).super_VectorView<diligent_spirv_cross::Variant>,(ulong)uVar2);
  bVar1 = Variant::empty(pVVar6);
  if (!bVar1) {
    uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)((long)&this_local + 4));
    pVVar6 = VectorView<diligent_spirv_cross::Variant>::operator[]
                       (&(this->ids).super_VectorView<diligent_spirv_cross::Variant>,(ulong)uVar2);
    TVar3 = Variant::get_type(pVVar6);
    if (TVar3 == type) goto LAB_00de56a8;
  }
  switch(type) {
  case TypeType:
  case TypeConstantOp:
  case TypeUndef:
    SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_8UL>::push_back
              (&this->ids_for_constant_undef_or_type,
               (TypedID<(diligent_spirv_cross::Types)0> *)((long)&this_local + 4));
    break;
  case TypeVariable:
    SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_8UL>::push_back
              (&this->ids_for_constant_or_variable,
               (TypedID<(diligent_spirv_cross::Types)0> *)((long)&this_local + 4));
    break;
  case TypeConstant:
    SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_8UL>::push_back
              (&this->ids_for_constant_or_variable,
               (TypedID<(diligent_spirv_cross::Types)0> *)((long)&this_local + 4));
    SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_8UL>::push_back
              (&this->ids_for_constant_undef_or_type,
               (TypedID<(diligent_spirv_cross::Types)0> *)((long)&this_local + 4));
    break;
  default:
  }
LAB_00de56a8:
  uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)((long)&this_local + 4));
  pVVar6 = VectorView<diligent_spirv_cross::Variant>::operator[]
                     (&(this->ids).super_VectorView<diligent_spirv_cross::Variant>,(ulong)uVar2);
  bVar1 = Variant::empty(pVVar6);
  if (bVar1) {
    SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_8UL>::push_back
              (this->ids_for_type + type,
               (TypedID<(diligent_spirv_cross::Types)0> *)((long)&this_local + 4));
  }
  else {
    uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)((long)&this_local + 4));
    pVVar6 = VectorView<diligent_spirv_cross::Variant>::operator[]
                       (&(this->ids).super_VectorView<diligent_spirv_cross::Variant>,(ulong)uVar2);
    TVar3 = Variant::get_type(pVVar6);
    if (TVar3 != type) {
      uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)((long)&this_local + 4));
      pVVar6 = VectorView<diligent_spirv_cross::Variant>::operator[]
                         (&(this->ids).super_VectorView<diligent_spirv_cross::Variant>,(ulong)uVar2)
      ;
      TVar3 = Variant::get_type(pVVar6);
      remove_typed_id(this,TVar3,this_local._4_4_);
      SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_8UL>::push_back
                (this->ids_for_type + type,
                 (TypedID<(diligent_spirv_cross::Types)0> *)((long)&this_local + 4));
    }
  }
  return;
}

Assistant:

void ParsedIR::add_typed_id(Types type, ID id)
{
	assert(id < ids.size());

	if (loop_iteration_depth_hard != 0)
		SPIRV_CROSS_THROW("Cannot add typed ID while looping over it.");

	if (loop_iteration_depth_soft != 0)
	{
		if (!ids[id].empty())
			SPIRV_CROSS_THROW("Cannot override IDs when loop is soft locked.");
		return;
	}

	if (ids[id].empty() || ids[id].get_type() != type)
	{
		switch (type)
		{
		case TypeConstant:
			ids_for_constant_or_variable.push_back(id);
			ids_for_constant_undef_or_type.push_back(id);
			break;

		case TypeVariable:
			ids_for_constant_or_variable.push_back(id);
			break;

		case TypeType:
		case TypeConstantOp:
		case TypeUndef:
			ids_for_constant_undef_or_type.push_back(id);
			break;

		default:
			break;
		}
	}

	if (ids[id].empty())
	{
		ids_for_type[type].push_back(id);
	}
	else if (ids[id].get_type() != type)
	{
		remove_typed_id(ids[id].get_type(), id);
		ids_for_type[type].push_back(id);
	}
}